

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O2

int __thiscall QPDFObjectHandle::getIntValueAsInt(QPDFObjectHandle *this)

{
  longlong lVar1;
  allocator<char> local_29;
  string local_28;
  
  lVar1 = getIntValue(this);
  if (lVar1 < -0x80000000) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_28,"requested value of integer is too small; returning INT_MIN",
               &local_29);
    warnIfPossible(this,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    lVar1 = 0x80000000;
  }
  else if (0x7fffffff < lVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_28,"requested value of integer is too big; returning INT_MAX",
               &local_29);
    warnIfPossible(this,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    lVar1 = 0x7fffffff;
  }
  return (int)lVar1;
}

Assistant:

int
QPDFObjectHandle::getIntValueAsInt() const
{
    int result = 0;
    long long v = getIntValue();
    if (v < INT_MIN) {
        QTC::TC("qpdf", "QPDFObjectHandle int returning INT_MIN");
        warnIfPossible("requested value of integer is too small; returning INT_MIN");
        result = INT_MIN;
    } else if (v > INT_MAX) {
        QTC::TC("qpdf", "QPDFObjectHandle int returning INT_MAX");
        warnIfPossible("requested value of integer is too big; returning INT_MAX");
        result = INT_MAX;
    } else {
        result = static_cast<int>(v);
    }
    return result;
}